

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_mesh_builder.cxx
# Opt level: O3

void __thiscall
xray_re::xr_mesh_builder::remove_back_faces(xr_mesh_builder *this,float normal_tolerance)

{
  byte *pbVar1;
  vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_> *normals;
  long lVar2;
  pointer pbVar3;
  pointer puVar4;
  pointer pbVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  uint32_t uVar12;
  uint16_t uVar13;
  uint16_t uVar14;
  bool bVar15;
  anon_union_8_2_d279a524_for_b_face_2 *paVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  uint32_t *puVar20;
  pointer pbVar21;
  uint32_t *puVar22;
  ulong uVar23;
  uint32_t *puVar24;
  int iVar25;
  uint uVar26;
  long lVar27;
  undefined4 *puVar28;
  b_face *pbVar29;
  ulong v1;
  ulong v0;
  pointer pbVar30;
  uint uVar31;
  b_face *pbVar32;
  ulong uVar33;
  xr_mesh_builder *pxVar34;
  int side;
  vector<unsigned_int,_std::allocator<unsigned_int>_> adjacents;
  vector<int,_std::allocator<int>_> sides;
  int local_cc;
  b_face *local_c8;
  void *local_c0;
  uint local_b4;
  anon_union_8_2_d279a524_for_b_face_2 *local_b0;
  b_face *local_a8;
  pointer local_a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_98;
  ulong local_78;
  xr_mesh_builder *local_70;
  pointer local_68;
  long local_60;
  vector<int,_std::allocator<int>_> local_58;
  ulong local_40;
  ulong local_38;
  
  local_60 = CONCAT44(local_60._4_4_,normal_tolerance);
  generate_vertex_faces(this);
  pbVar29 = (this->m_faces).
            super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar32 = (this->m_faces).
            super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_40 = (long)pbVar32 - (long)pbVar29 >> 6;
  local_a0 = (pointer)0x0;
  local_38 = -(ulong)(local_40 >> 0x3e != 0) | (long)pbVar32 - (long)pbVar29 >> 4;
  local_70 = this;
  local_c0 = operator_new__(local_38);
  local_78 = (long)pbVar32 - (long)pbVar29;
  local_c8 = pbVar32;
  local_a8 = pbVar29;
  if (local_78 != 0) {
    memset(local_c0,0xff,(long)local_78 >> 4 & 0xfffffffffffffffc);
    local_68 = (local_70->m_vertex_faces).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
    normals = &local_70->m_normals;
    local_b0 = &local_a8->field_1;
    pbVar29 = local_a8;
    do {
      uVar26 = (pbVar29->field_0).field_0.v[0];
      uVar31 = local_68[uVar26];
      while (uVar31 != 0xffffffff) {
        uVar18 = (ulong)uVar31;
        bVar15 = b_face::is_back(pbVar29,local_a8 + uVar18,normals,(float)local_60);
        if (bVar15) {
          *(uint *)((long)local_c0 + ((ulong)local_a0 & 0xffffffff) * 4) = uVar31;
          *(int *)((long)local_c0 + uVar18 * 4) = (int)local_a0;
          break;
        }
        lVar17 = 0;
        do {
          if (lVar17 == -3) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh_builder.h"
                          ,0xa4,
                          "uint32_t xray_re::xr_mesh_builder::b_face::next_face_idx(uint_fast32_t) const"
                         );
          }
          lVar19 = lVar17 + -1;
          lVar2 = lVar17 * 4;
          lVar17 = lVar19;
        } while (*(uint *)((long)local_b0 + lVar2 + uVar18 * 0x40 + -0x28) != uVar26);
        uVar31 = *(uint *)((long)local_b0 + lVar19 * 4 + uVar18 * 0x40);
      }
      pbVar29 = pbVar29 + 1;
      local_a0 = (pointer)(ulong)((int)local_a0 + 1);
    } while (pbVar29 != local_c8);
  }
  pxVar34 = local_70;
  create_edges(local_70,false);
  local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (uint *)0x0;
  local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&local_98,0x200);
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  std::vector<int,_std::allocator<int>_>::reserve(&local_58,0x100);
  paVar16 = (anon_union_8_2_d279a524_for_b_face_2 *)operator_new__(local_38);
  uVar18 = local_40;
  if (local_c8 != local_a8) {
    memset(paVar16,0xff,(long)local_78 >> 4 & 0xfffffffffffffffc);
    local_c8 = (b_face *)0x0;
    uVar33 = 0;
    local_b0 = paVar16;
    do {
      if ((*(int *)((long)local_c0 + uVar33 * 4) != -1) &&
         (*(int *)((long)paVar16 + uVar33 * 4) == -1)) {
        local_cc = 0;
        lVar17 = (uVar33 & 0xffffffff) * 4;
        *(int *)((long)paVar16 + lVar17) = (int)local_c8;
        iVar25 = (int)local_c8 + 1;
        local_68 = (pointer)CONCAT44(local_68._4_4_,iVar25);
        *(int *)((long)paVar16 + (ulong)*(uint *)((long)local_c0 + lVar17) * 4) = iVar25;
        local_a8 = (b_face *)(uVar33 & 0xffffffff);
        local_78 = uVar33;
        do {
          pbVar21 = (pxVar34->m_faces).
                    super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_a0 = pbVar21 + (long)local_a8;
          local_60 = 3;
          v1 = (ulong)pbVar21[(long)local_a8].field_0.field_0.v[0];
          do {
            uVar26 = *(uint *)((long)local_a0 + local_60 * 4 + -4);
            v0 = (ulong)uVar26;
            local_60 = local_60 + -1;
            pbVar3 = (pxVar34->m_edges).
                     super__Vector_base<xray_re::xr_mesh_builder::b_edge,_std::allocator<xray_re::xr_mesh_builder::b_edge>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            puVar4 = (pxVar34->m_vertex_edges).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            puVar22 = puVar4 + v0;
LAB_00174317:
            uVar18 = (ulong)*puVar22;
            if (uVar18 != 0xffffffff) goto code_r0x0017431e;
            puVar22 = puVar4 + v1;
            do {
              uVar18 = (ulong)*puVar22;
              if (uVar18 == 0xffffffff) {
                __assert_fail("edge && (v0 == edge->v1 || v1 == edge->v1)",
                              "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh_builder.cxx"
                              ,0x14c,"void xray_re::xr_mesh_builder::remove_back_faces(float)");
              }
              puVar22 = &pbVar3[uVar18].link;
            } while (pbVar3[uVar18].v1 != uVar26);
LAB_0017435a:
            if (pbVar3[uVar18].size < 5) {
              pbVar29 = (b_face *)(ulong)pbVar3[uVar18].face0;
              while (pbVar29 != (b_face *)0xffffffff) {
                pbVar32 = (local_70->m_faces).
                          super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
                          ._M_impl.super__Vector_impl_data._M_start + (long)pbVar29;
                if (((pbVar29 != local_a8) &&
                    (pbVar29 != (b_face *)(ulong)*(uint *)((long)local_c0 + (long)local_a8 * 4))) &&
                   (*(int *)((long)local_b0 + (long)pbVar29 * 4) == -1)) {
                  bVar15 = b_face::is_same_layer(pbVar32,v0,v1);
                  paVar16 = local_b0;
                  uVar31 = *(uint *)((long)local_c0 + (long)pbVar29 * 4);
                  uVar33 = (ulong)uVar31;
                  if (uVar33 == 0xffffffff) {
                    if (pbVar3[uVar18].size < 4) {
                      local_cc = local_cc + (-(uint)bVar15 | 1);
                      goto LAB_001743e1;
                    }
                  }
                  else {
                    puVar28 = (undefined4 *)((long)local_b0 + (long)pbVar29 * 4);
                    if (bVar15) {
                      local_b4 = (uint)pbVar29;
                      if (local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish ==
                          local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage) {
                        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                        _M_realloc_insert<unsigned_int>
                                  (&local_98,
                                   (iterator)
                                   local_98.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish,&local_b4);
                      }
                      else {
                        *local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish = local_b4;
                        local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish =
                             local_98.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish + 1;
                      }
                      *puVar28 = (int)local_c8;
                      puVar28 = (undefined4 *)((long)paVar16 + uVar33 * 4);
                    }
                    else {
                      local_b4 = uVar31;
                      if (local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish ==
                          local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage) {
                        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                        _M_realloc_insert<unsigned_int>
                                  (&local_98,
                                   (iterator)
                                   local_98.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish,&local_b4);
                      }
                      else {
                        *local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish = uVar31;
                        local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish =
                             local_98.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish + 1;
                      }
                      *(int *)((long)paVar16 + uVar33 * 4) = (int)local_c8;
                    }
                    *puVar28 = local_68._0_4_;
                  }
                  break;
                }
LAB_001743e1:
                lVar17 = 3;
                uVar33 = 0xffffffffffffffff;
                do {
                  uVar23 = uVar33;
                  lVar19 = lVar17;
                  lVar17 = lVar19 + -1;
                  if (lVar19 == 0) goto LAB_001746a2;
                  uVar33 = uVar23 - 1;
                } while (*(uint *)((long)pbVar32 + lVar17 * 4) != uVar26);
                lVar2 = 0;
                do {
                  lVar27 = lVar2;
                  if (lVar27 == -0xc) {
LAB_001746a2:
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh_builder.h"
                                  ,0x9a,
                                  "uint_fast32_t xray_re::xr_mesh_builder::b_face::local_vert_idx(uint_fast32_t) const"
                                 );
                  }
                  uVar23 = uVar23 + 1;
                  lVar2 = lVar27 + -4;
                } while (v1 != *(uint *)((long)&pbVar32->field_0 + lVar27 + 8));
                if ((lVar17 == 0xffffffff) || (lVar27 + -4 == 0x3fffffff0)) {
                  __assert_fail("i0 != BAD_IDX && i1 != BAD_IDX",
                                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh_builder.h"
                                ,0xac,
                                "uint32_t xray_re::xr_mesh_builder::b_face::next_face_idx(uint_fast32_t, uint_fast32_t) const"
                               );
                }
                puVar22 = (pbVar32->field_0).field_0.link + 2;
                puVar20 = (uint32_t *)((long)&pbVar32->field_0 + lVar19 * 4 + 0x20);
                if (uVar23 == 0xfffffffffffffffe) {
                  puVar20 = puVar22;
                }
                puVar24 = (uint32_t *)((long)&pbVar32->field_0 + lVar27 + 0x2c);
                if (uVar23 == 2) {
                  puVar24 = puVar22;
                }
                if (0x7fffffffffffffff < uVar23) {
                  puVar24 = puVar20;
                }
                bVar15 = pbVar29 == (b_face *)(ulong)*puVar24;
                pbVar29 = (b_face *)(ulong)*puVar24;
                if (bVar15) break;
              }
            }
            uVar18 = local_40;
            pxVar34 = local_70;
            uVar33 = local_78;
            v1 = v0;
          } while (local_60 != 0);
          if (local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start ==
              local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            if (local_cc == 0) {
              local_cc = -1;
            }
            if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_58,
                         (iterator)
                         local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,&local_cc);
            }
            else {
              *local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish = local_cc;
              local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
            }
            local_c8 = (b_face *)(ulong)((int)local_c8 + 2);
            paVar16 = local_b0;
            break;
          }
          local_a8 = (b_face *)
                     (ulong)local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_finish[-1];
          local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + -1;
        } while( true );
      }
      uVar33 = uVar33 + 1;
    } while (uVar33 != uVar18);
  }
  pbVar21 = (pxVar34->m_faces).
            super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar5 = (pxVar34->m_faces).
           super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar21 != pbVar5) {
    uVar26 = 0;
    pbVar30 = pbVar21;
    do {
      if (*(int *)((long)local_c0 + (ulong)uVar26 * 4) == -1) {
LAB_00174608:
        if (pbVar30 != pbVar21) {
          uVar6 = *(undefined8 *)&pbVar30->field_0;
          uVar7 = *(undefined8 *)((long)&pbVar30->field_0 + 8);
          uVar8 = *(undefined8 *)((long)&pbVar30->field_0 + 0x10);
          uVar9 = *(undefined8 *)((long)&pbVar30->field_0 + 0x18);
          uVar10 = *(undefined8 *)((long)&pbVar30->field_0 + 0x20);
          uVar11 = *(undefined8 *)((long)&pbVar30->field_0 + 0x28);
          uVar12 = pbVar30->tag;
          uVar13 = pbVar30->temp;
          uVar14 = pbVar30->sector;
          pbVar21->field_1 = pbVar30->field_1;
          pbVar21->tag = uVar12;
          pbVar21->temp = uVar13;
          pbVar21->sector = uVar14;
          *(undefined8 *)((long)&pbVar21->field_0 + 0x20) = uVar10;
          *(undefined8 *)((long)&pbVar21->field_0 + 0x28) = uVar11;
          *(undefined8 *)((long)&pbVar21->field_0 + 0x10) = uVar8;
          *(undefined8 *)((long)&pbVar21->field_0 + 0x18) = uVar9;
          *(undefined8 *)&pbVar21->field_0 = uVar6;
          *(undefined8 *)((long)&pbVar21->field_0 + 8) = uVar7;
        }
        pbVar21 = pbVar21 + 1;
      }
      else {
        uVar31 = *(uint *)((long)paVar16 + (ulong)uVar26 * 4);
        iVar25 = -local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar31 >> 1];
        if ((uVar31 & 1) == 0) {
          iVar25 = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar31 >> 1];
        }
        if (iVar25 < 0) {
          pbVar1 = (byte *)((long)&pbVar30->field_1 + 6);
          *pbVar1 = *pbVar1 | 8;
          goto LAB_00174608;
        }
      }
      pbVar30 = pbVar30 + 1;
      uVar26 = uVar26 + 1;
    } while (pbVar30 != pbVar5);
    if (pbVar21 !=
        (pxVar34->m_faces).
        super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      (pxVar34->m_faces).
      super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar21;
    }
  }
  operator_delete__(paVar16);
  operator_delete__(local_c0);
  if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
code_r0x0017431e:
  puVar22 = &pbVar3[uVar18].link;
  if (v1 == pbVar3[uVar18].v1) goto LAB_0017435a;
  goto LAB_00174317;
}

Assistant:

void xr_mesh_builder::remove_back_faces(float normal_tolerance)
{
	generate_vertex_faces();

	size_t num_faces = m_faces.size();

	uint32_t* face_backs = new uint32_t[num_faces];
	xr_uninitialized_fill_n(face_backs, num_faces, BAD_IDX);
	uint32_t face_idx = 0;
	for (b_face_vec_cit it = m_faces.begin(), end = m_faces.end();
			it != end; ++it, ++face_idx) {
		for (uint_fast32_t next = m_vertex_faces[it->v0]; next != BAD_IDX;) {
			b_face& face = m_faces[next];
			if (it->is_back(face, m_normals, normal_tolerance)) {
				face_backs[face_idx] = uint32_t(next & UINT32_MAX);
				face_backs[next] = face_idx;
				break;
			}
			next = face.next_face_idx(it->v0);
		}
	}

	create_edges();

	std::vector<uint32_t> adjacents;
	adjacents.reserve(512);
	std::vector<int> sides;
	sides.reserve(256);

	uint32_t* lgroups = new uint32_t[num_faces];
	xr_uninitialized_fill_n(lgroups, num_faces, BAD_IDX);

	uint32_t lgroup = 0;
	for (size_t k = 0; k != num_faces; ++k) {
		if (face_backs[k] == BAD_IDX || lgroups[k] != BAD_IDX)
			continue;
		int side = 0;
		face_idx = uint32_t(k & UINT32_MAX);
		lgroups[face_idx] = lgroup;
		lgroups[face_backs[face_idx]] = lgroup + 1;
		for (;;) {
			const b_face& face = m_faces[face_idx];
			for (uint_fast32_t i = 3, v0, v1 = face.v0; i != 0; v1 = v0) {
				b_edge* edge = find_edge(v0 = face.v[--i], v1);
				xr_assert(edge && (v0 == edge->v1 || v1 == edge->v1));
				if (edge->size > 4)
					continue;
				for (uint_fast32_t next = edge->face0; next != BAD_IDX;) {
					const b_face& adjacent = m_faces[next];
					if (next != face_idx && next != face_backs[face_idx] &&
							lgroups[next] == BAD_IDX) {
						bool same_layer = adjacent.is_same_layer(v0, v1);
						uint_fast32_t next_back = face_backs[next];
						if (next_back == BAD_IDX) {
							if (edge->size > 3)
								break;
							if (same_layer)
								--side;
							else
								++side;
						} else if (same_layer) {
							adjacents.push_back(uint32_t(next & UINT32_MAX));
							lgroups[next] = lgroup;
							lgroups[next_back] = lgroup + 1;
							break;
						} else {
							adjacents.push_back(uint32_t(next_back & UINT32_MAX));
							lgroups[next_back] = lgroup;
							lgroups[next] = lgroup + 1;
							break;
						}
					}

					// check for endless cycle. It`s in build 2232 l06_rostok
					uint_fast32_t temp = adjacent.next_face_idx(v0, v1);
					if (next == temp)
						break;
					next = temp;
				}
			}
			if (adjacents.empty())
				break;
			face_idx = adjacents.back();
			adjacents.pop_back();

		}
		if (side == 0)
			side = -1;
		sides.push_back(side);
		lgroup += 2;
	}

	face_idx = 0;
	b_face_vec_it last = m_faces.begin();
	for (b_face_vec_it it = last, end = m_faces.end(); it != end; ++it, ++face_idx) {
		if (face_backs[face_idx] != BAD_IDX) {
			int side = sides[(lgroup = lgroups[face_idx])/2];
			if (lgroup & 1)
				side = -side;
			if (side < 0)
				it->surface.flags |= RSF_TWO_SIDED;
			else
				continue;
		}
		if (last != it)
			*last = *it;
		++last;
	}
	m_faces.erase(last, m_faces.end());

	delete[] lgroups;
	delete[] face_backs;
}